

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipoint-counter.cpp
# Opt level: O0

void __thiscall mahjong::MinipointCounter::computeMelds(MinipointCounter *this)

{
  bool bVar1;
  vector<mahjong::Meld,_std::allocator<mahjong::Meld>_> *this_00;
  reference pMVar2;
  int local_58;
  int basic;
  undefined1 local_48 [8];
  Meld it;
  const_iterator __end1;
  const_iterator __begin1;
  vector<mahjong::Meld,_std::allocator<mahjong::Meld>_> *__range1;
  MinipointCounter *this_local;
  
  this_00 = &this->hand->melds;
  __end1 = std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::begin(this_00);
  it._24_8_ = std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_mahjong::Meld_*,_std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>_>
                                     *)&it.is_open), bVar1) {
    pMVar2 = __gnu_cxx::
             __normal_iterator<const_mahjong::Meld_*,_std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>_>
             ::operator*(&__end1);
    Meld::Meld((Meld *)local_48,pMVar2);
    bVar1 = Meld::isTripletOrQuad((Meld *)local_48);
    if (bVar1) {
      local_58 = 2;
      bVar1 = Meld::isHonors((Meld *)local_48);
      if ((bVar1) || (bVar1 = Meld::isTerminals((Meld *)local_48), bVar1)) {
        local_58 = 4;
      }
      bVar1 = Meld::isOpen((Meld *)local_48);
      if (!bVar1) {
        local_58 = local_58 << 1;
      }
      bVar1 = Meld::isQuad((Meld *)local_48);
      if (bVar1) {
        local_58 = local_58 << 2;
      }
      this->point = local_58 + this->point;
    }
    Meld::~Meld((Meld *)local_48);
    __gnu_cxx::
    __normal_iterator<const_mahjong::Meld_*,_std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void MinipointCounter::computeMelds()
{
	for (auto it : hand.melds)
	{
		if (it.isTripletOrQuad())
		{
			auto basic = 2;

			if (it.isHonors() || it.isTerminals())
			{
				basic *= 2;
			}

			if (!it.isOpen())
			{
				basic *= 2;
			}

			if (it.isQuad())
			{
				basic *= 4;
			}

			point += basic;
		}
	}
}